

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*>::reallocateAndGrow
          (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *old)

{
  long lVar1;
  bool bVar2;
  QResourceRoot **ppQVar3;
  QPodArrayOps<(anonymous_namespace)::QResourceRoot_*> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *in_stack_ffffffffffffff70;
  QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *in_stack_ffffffffffffff78;
  QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)&DAT_aaaaaaaaaaaaaaaa,
                 (qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (ppQVar3 = data((QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)
                       &stack0xffffffffffffffe0), ppQVar3 == (QResourceRoot **)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_002ec930;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<(anonymous_namespace)::QResourceRoot_*> *)
                  operator->((QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)0x2ec843);
        begin((QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)0x2ec852);
        QtPrivate::QPodArrayOps<(anonymous_namespace)::QResourceRoot_*>::copyAppend
                  (this_00,(QResourceRoot **)in_stack_ffffffffffffff78,
                   (QResourceRoot **)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)
             operator->((QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)
                        &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)0x2ec88b);
        begin((QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)0x2ec89a);
        QtPrivate::QPodArrayOps<(anonymous_namespace)::QResourceRoot_*>::moveAppend
                  ((QPodArrayOps<(anonymous_namespace)::QResourceRoot_*> *)in_stack_ffffffffffffff70
                   ,(QResourceRoot **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (QResourceRoot **)0x2ec8b8);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<(anonymous_namespace)::QResourceRoot_*> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<(anonymous_namespace)::QResourceRoot_*>::reallocate
              ((QPodArrayOps<(anonymous_namespace)::QResourceRoot_*> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_002ec930:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }